

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

long __thiscall tetgenmesh::removeslivers(tetgenmesh *this,int chkencflag)

{
  badface *searchtet;
  uint *puVar1;
  arraypool *this_00;
  char *pcVar2;
  tetrahedron *pppdVar3;
  int iVar4;
  arraypool *paVar5;
  long *plVar6;
  char *this_01;
  long lVar7;
  tetgenmesh *ptVar8;
  long lVar9;
  double dVar10;
  undefined8 uVar11;
  badface *parybface;
  long local_98;
  double maxcosd;
  tetgenmesh *local_88;
  long local_80;
  triface local_78;
  double cosdd [6];
  
  local_78.tet = (tetrahedron *)0x0;
  paVar5 = (arraypool *)operator_new(0x30);
  paVar5->objectbytes = 0x88;
  paVar5->objectsperblock = 0x400;
  paVar5->log2objectsperblock = 10;
  paVar5->objectsperblockmark = 0x3ff;
  paVar5->toparraylen = 0;
  paVar5->totalmemory = 0;
  paVar5->toparray = (char **)0x0;
  paVar5->objects = 0;
  ptVar8 = (tetgenmesh *)0x0;
  lVar9 = 0;
  uVar11 = 0;
  do {
    this_00 = this->unflipqueue;
    this->unflipqueue = paVar5;
    if ((this_00->objects < 1) || (this->steinerleft == 0)) break;
    this_01 = (char *)ptVar8;
    local_88 = ptVar8;
    local_80 = lVar9;
    if (1 < this->b->verbose) {
      this_01 = "    Splitting bad quality tets [%d]#:  %ld.\n";
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",uVar11);
    }
    lVar9 = 0;
    local_98 = 0;
    while ((lVar7 = local_98, lVar9 < this_00->objects && (this->steinerleft != 0))) {
      pcVar2 = this_00->toparray[(uint)lVar9 >> ((byte)this_00->log2objectsperblock & 0x1f)];
      lVar7 = (long)this_00->objectbytes * (long)(int)(this_00->objectsperblockmark & (uint)lVar9);
      searchtet = (badface *)(pcVar2 + lVar7);
      this_01 = (char *)this;
      iVar4 = gettetrahedron(this,*(point *)(pcVar2 + lVar7 + 0x58),
                             *(point *)(pcVar2 + lVar7 + 0x60),*(point *)(pcVar2 + lVar7 + 0x68),
                             *(point *)(pcVar2 + lVar7 + 0x70),(triface *)searchtet);
      if (iVar4 != 0) {
        dVar10 = searchtet->key;
        if (((dVar10 == 0.0) && (!NAN(dVar10))) || ((searchtet->tt).ver != 0xb)) {
          pppdVar3 = (searchtet->tt).tet;
          this_01 = (char *)this;
          tetalldihedral(this,(point)pppdVar3[4],(point)pppdVar3[5],(point)pppdVar3[6],
                         (point)pppdVar3[7],searchtet->cent,&searchtet->key,(double *)0x0);
          dVar10 = searchtet->key;
        }
        if (dVar10 < this->cosslidihed) {
          local_78.tet = (searchtet->tt).tet;
          for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
            dVar10 = *(double *)((long)searchtet->cent + lVar7 * 2);
            if (dVar10 < this->cosslidihed) {
              local_78.ver = *(int *)((long)edge2ver + lVar7);
              iVar4 = splitsliver(this,&local_78,dVar10,chkencflag);
              if (iVar4 == 0) goto LAB_0013ed51;
              memorypool::traversalinit(this->badtetrahedrons);
              while( true ) {
                plVar6 = (long *)memorypool::traverse(this->badtetrahedrons);
                if (plVar6 == (long *)0x0) break;
                lVar7 = *plVar6;
                puVar1 = (uint *)(lVar7 + (long)this->elemmarkerindex * 4);
                *puVar1 = *puVar1 & 0xffffefff;
                tetalldihedral(this,*(point *)(lVar7 + 0x20),*(point *)(lVar7 + 0x28),
                               *(point *)(lVar7 + 0x30),*(point *)(lVar7 + 0x38),cosdd,&maxcosd,
                               (double *)0x0);
                if (maxcosd < this->cosslidihed) {
                  arraypool::newindex(this->unflipqueue,&parybface);
                  parybface->forg = *(point *)(lVar7 + 0x20);
                  parybface->fdest = *(point *)(lVar7 + 0x28);
                  parybface->fapex = *(point *)(lVar7 + 0x30);
                  parybface->foppo = *(point *)(lVar7 + 0x38);
                  (parybface->tt).tet = (tetrahedron *)*plVar6;
                  (parybface->tt).ver = 0xb;
                  parybface->key = maxcosd;
                  for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
                    parybface->cent[lVar7] = cosdd[lVar7];
                  }
                }
              }
              local_98 = local_98 + 1;
              this_01 = (char *)this->badtetrahedrons;
              memorypool::restart((memorypool *)this_01);
              goto LAB_0013ee56;
            }
LAB_0013ed51:
          }
          arraypool::newindex(this->unflipqueue,&parybface);
          this_01 = (char *)parybface;
          badface::operator=(parybface,searchtet);
        }
      }
LAB_0013ee56:
      lVar9 = lVar9 + 1;
    }
    this_00->objects = 0;
    if (1 < this->b->verbose) {
      this_01 = "    Split %ld tets.\n";
      printf("    Split %ld tets.\n",local_98);
    }
    lVar9 = local_80 + lVar7;
    uVar11 = 1;
    ptVar8 = (tetgenmesh *)CONCAT71((int7)((ulong)this_01 >> 8),1);
    paVar5 = this_00;
  } while ((~(byte)local_88 & lVar7 != 0) != 0);
  arraypool::~arraypool(this_00);
  operator_delete(this_00,0x30);
  return lVar9;
}

Assistant:

long tetgenmesh::removeslivers(int chkencflag)
{
  arraypool *flipqueue, *swapqueue;
  badface *bface, *parybface;
  triface slitet, *parytet;
  point *ppt;
  REAL cosdd[6], maxcosd;
  long totalsptcount, sptcount;
  int iter, i, j, k;

  //assert(unflipqueue->objects > 0l);
  flipqueue = new arraypool(sizeof(badface), 10);

  // Swap the two flip queues.
  swapqueue = flipqueue;
  flipqueue = unflipqueue;
  unflipqueue = swapqueue;

  totalsptcount = 0l;
  iter = 0;

  while ((flipqueue->objects > 0l) && (steinerleft != 0)) {

    sptcount = 0l;

    if (b->verbose > 1) {
      printf("    Splitting bad quality tets [%d]#:  %ld.\n",
             iter, flipqueue->objects);
    }

    for (k = 0; (k < flipqueue->objects) && (steinerleft != 0); k++) {      
      bface  = (badface *) fastlookup(flipqueue, k);
      if (gettetrahedron(bface->forg, bface->fdest, bface->fapex,
                         bface->foppo, &bface->tt)) {
        if ((bface->key == 0) || (bface->tt.ver != 11)) {
          // Here we need to re-compute the quality. Since other smoothing
          //   operation may have moved the vertices of this tet.
          ppt = (point *) & (bface->tt.tet[4]);
          tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], bface->cent, 
                         &bface->key, NULL);
        }
        if (bface->key < cosslidihed) { 
          // It is a sliver. Try to split it.
          slitet.tet = bface->tt.tet;
          //cosdd = bface->cent;
          for (j = 0; j < 6; j++) {
            if (bface->cent[j] < cosslidihed) { 
              // Found a large dihedral angle.
              slitet.ver = edge2ver[j]; // Go to the edge.
              if (splitsliver(&slitet, bface->cent[j], chkencflag)) {
                sptcount++;
                break;
              }
            }
          } // j
          if (j < 6) {
            // A sliver is split. Queue new slivers.
            badtetrahedrons->traversalinit();
            parytet = (triface *) badtetrahedrons->traverse();
            while (parytet != NULL) {
              unmarktest2(*parytet);
              ppt = (point *) & (parytet->tet[4]);
              tetalldihedral(ppt[0], ppt[1], ppt[2], ppt[3], cosdd, 
                             &maxcosd, NULL);
              if (maxcosd < cosslidihed) {
                // A new sliver. Queue it.
                unflipqueue->newindex((void **) &parybface);
                parybface->forg = ppt[0];
                parybface->fdest = ppt[1];
                parybface->fapex = ppt[2];
                parybface->foppo = ppt[3];
                parybface->tt.tet = parytet->tet;
                parybface->tt.ver = 11;
                parybface->key = maxcosd;
                for (i = 0; i < 6; i++) {
                  parybface->cent[i] = cosdd[i];
                }
              }
              parytet = (triface *) badtetrahedrons->traverse();
            }
            badtetrahedrons->restart();
          } else {
            // Didn't split. Queue it again.
            unflipqueue->newindex((void **) &parybface);
            *parybface = *bface;
          } // if (j == 6)
        } // if (bface->key < cosslidihed)
      } // if (gettetrahedron(...))
    } // k

    flipqueue->restart();

    if (b->verbose > 1) {
      printf("    Split %ld tets.\n", sptcount);
    }
    totalsptcount += sptcount;

    if (sptcount == 0l) {
      // No point has been smoothed. 
      break;
    } else {
      iter++;
      if (iter == 2) { //if (iter >= b->optpasses) {
        break;
      }
    }

    // Swap the two flip queues.
    swapqueue = flipqueue;
    flipqueue = unflipqueue;
    unflipqueue = swapqueue;
  } // while

  delete flipqueue;

  return totalsptcount;
}